

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_obj.h
# Opt level: O1

char * parse_float(char *ptr,float *val)

{
  byte *pbVar1;
  byte bVar2;
  double *pdVar3;
  uint uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  do {
    bVar2 = *ptr;
    if (bVar2 < 0x20) {
      if ((bVar2 != 9) && (bVar2 != 0xd)) goto LAB_0015074c;
    }
    else if (bVar2 != 0x20) {
      if (bVar2 == 0x2b) {
        ptr = (char *)((byte *)ptr + 1);
      }
      else if (bVar2 == 0x2d) {
        ptr = (char *)((byte *)ptr + 1);
        dVar5 = -1.0;
        goto LAB_00150754;
      }
LAB_0015074c:
      dVar5 = 1.0;
LAB_00150754:
      dVar7 = 0.0;
      dVar6 = 0.0;
      bVar2 = *ptr;
      while (0xf5 < (byte)(bVar2 - 0x3a)) {
        dVar6 = dVar6 * 10.0 + (double)(int)(bVar2 - 0x30);
        pbVar1 = (byte *)ptr + 1;
        ptr = (char *)((byte *)ptr + 1);
        bVar2 = *pbVar1;
      }
      pbVar1 = (byte *)ptr + (bVar2 == 0x2e);
      bVar2 = ((byte *)ptr)[bVar2 == 0x2e];
      if (0xf5 < (byte)(bVar2 - 0x3a)) {
        dVar7 = 0.0;
        dVar8 = 1.0;
        do {
          dVar7 = dVar7 * 10.0 + (double)(int)(bVar2 - 0x30);
          dVar8 = dVar8 * 10.0;
          bVar2 = pbVar1[1];
          pbVar1 = pbVar1 + 1;
        } while (0xf5 < (byte)(bVar2 - 0x3a));
        dVar7 = dVar7 / dVar8;
      }
      dVar6 = dVar6 + dVar7;
      if ((bVar2 & 0xdf) == 0x45) {
        if (pbVar1[1] == 0x2d) {
          pbVar1 = pbVar1 + 2;
          pdVar3 = POWER_10_NEG;
        }
        else {
          pdVar3 = POWER_10_POS;
          if (pbVar1[1] == 0x2b) {
            pbVar1 = pbVar1 + 2;
          }
          else {
            pbVar1 = pbVar1 + 1;
          }
        }
        bVar2 = *pbVar1;
        uVar4 = 0;
        if (0xf5 < (byte)(bVar2 - 0x3a)) {
          uVar4 = 0;
          do {
            uVar4 = ((uint)bVar2 + uVar4 * 10) - 0x30;
            bVar2 = pbVar1[1];
            pbVar1 = pbVar1 + 1;
          } while (0xf5 < (byte)(bVar2 - 0x3a));
        }
        dVar7 = 0.0;
        if (uVar4 < 0x14) {
          dVar7 = pdVar3[uVar4];
        }
        dVar6 = dVar6 * dVar7;
      }
      *val = (float)(dVar5 * dVar6);
      return (char *)pbVar1;
    }
    ptr = (char *)((byte *)ptr + 1);
  } while( true );
}

Assistant:

static
const char* parse_float(const char* ptr, float* val)
{
   double        sign;
   double        num;
   double        fra;
   double        div;
   unsigned int  eval;
   const double* powers;


   ptr = skip_whitespace(ptr);

   switch (*ptr)
   {
   case '+':
       sign = 1.0;
       ptr++;
       break;

   case '-':
       sign = -1.0;
       ptr++;
       break;

   default:
       sign = 1.0;
       break;
   }


   num = 0.0;
   while (is_digit(*ptr))
       num = 10.0 * num + (double)(*ptr++ - '0');

   if (*ptr == '.')
       ptr++;

   fra = 0.0;
   div = 1.0;

   while (is_digit(*ptr))
   {
       fra  = 10.0 * fra + (double)(*ptr++ - '0');
       div *= 10.0;
   }

   num += fra / div;

   if (is_exponent(*ptr))
   {
       ptr++;

       switch (*ptr)
       {
       case '+':
           powers = POWER_10_POS;
           ptr++;
           break;

       case '-':
           powers = POWER_10_NEG;
           ptr++;
           break;

       default:
           powers = POWER_10_POS;
           break;
       }

       eval = 0;
       while (is_digit(*ptr))
           eval = 10 * eval + (*ptr++ - '0');

       num *= (eval >= MAX_POWER) ? 0.0 : powers[eval];
   }

   *val = (float)(sign * num);

   return ptr;
}